

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfragmentmap_p.h
# Opt level: O0

uint __thiscall
QFragmentMapData<QTextBlockData>::findNode(QFragmentMapData<QTextBlockData> *this,int k,uint field)

{
  uint uVar1;
  QTextBlockData *pQVar2;
  uint in_ESI;
  QFragmentMapData<QTextBlockData> *in_RDI;
  uint s;
  uint x;
  uint in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  uint local_20;
  uint local_1c;
  
  local_1c = root(in_RDI);
  local_20 = in_ESI;
  while( true ) {
    while( true ) {
      if (local_1c == 0) {
        return 0;
      }
      uVar1 = sizeLeft((QFragmentMapData<QTextBlockData> *)
                       CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
      if (uVar1 <= local_20) break;
      pQVar2 = F(in_RDI,local_1c);
      local_1c = (pQVar2->super_QFragment<3>).left;
    }
    in_stack_ffffffffffffffd4 = local_20;
    in_stack_ffffffffffffffd0 =
         sizeLeft((QFragmentMapData<QTextBlockData> *)CONCAT44(local_20,in_stack_ffffffffffffffd0),
                  in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    uVar1 = size((QFragmentMapData<QTextBlockData> *)
                 CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    if (in_stack_ffffffffffffffd4 < in_stack_ffffffffffffffd0 + uVar1) break;
    in_stack_ffffffffffffffcc =
         sizeLeft((QFragmentMapData<QTextBlockData> *)
                  CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                  in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    uVar1 = size((QFragmentMapData<QTextBlockData> *)
                 CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    local_20 = local_20 - (in_stack_ffffffffffffffcc + uVar1);
    pQVar2 = F(in_RDI,local_1c);
    local_1c = (pQVar2->super_QFragment<3>).right;
  }
  return local_1c;
}

Assistant:

uint QFragmentMapData<Fragment>::findNode(int k, uint field) const
{
    Q_ASSERT(field < Fragment::size_array_max);
    uint x = root();

    uint s = k;
    while (x) {
        if (sizeLeft(x, field) <= s) {
            if (s < sizeLeft(x, field) + size(x, field))
                return x;
            s -= sizeLeft(x, field) + size(x, field);
            x = F(x).right;
        } else {
            x = F(x).left;
        }
    }
    return 0;
}